

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mxv_basic_orix.cpp
# Opt level: O2

void mxv(Type *result,Type (*mx) [6000],Type *v)

{
  int i;
  long lVar1;
  int j;
  long lVar2;
  float fVar3;
  
  for (lVar1 = 0; lVar1 != 0x5dc; lVar1 = lVar1 + 1) {
    result[lVar1] = 0.0;
    fVar3 = 0.0;
    for (lVar2 = 0; lVar2 != 6000; lVar2 = lVar2 + 1) {
      fVar3 = fVar3 + (*mx)[lVar2] * v[lVar2];
      result[lVar1] = fVar3;
    }
    mx = mx + 1;
  }
  return;
}

Assistant:

void mxv(Type result[BCK], const Type mx[M/CHUNKS][N], const Type v[N])
{  
  for(int i = 0; i < BCK; i++) {
    result[i] = (Type)0;
    for(int j = 0; j < N; j++)
      result[i] += mx[i][j] * v[j];
  }
}